

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTExecutionInfo.cpp
# Opt level: O2

void __thiscall
TTD::ExecutionInfoManager::ProcessBPInfoPostBreak(ExecutionInfoManager *this,FunctionBody *fb)

{
  ScriptContext *pSVar1;
  TTDebuggerAbortException *this_00;
  
  pSVar1 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)fb);
  if (pSVar1->TTDShouldPerformReplayDebuggerAction == true) {
    if ((this->m_activeTTDBP).m_sourceScriptLogId != 0) {
      pSVar1 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)fb);
      ClearActiveBPInfo(this,pSVar1->threadContext->TTDContext);
    }
    if ((this->m_pendingTTDBP).m_sourceScriptLogId != 0) {
      pSVar1 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)fb);
      Js::StepController::Deactivate
                (&pSVar1->threadContext->debugManager->stepController,(InterpreterHaltState *)0x0);
      this_00 = (TTDebuggerAbortException *)__cxa_allocate_exception(0x20);
      TTDebuggerAbortException::TTDebuggerAbortException
                (this_00,2,(this->m_pendingTTDBP).m_etime,this->m_pendingTTDMoveMode,
                 L"Reverse operation requested.");
      __cxa_throw(this_00,&TTDebuggerAbortException::typeinfo,
                  TTDebuggerAbortException::~TTDebuggerAbortException);
    }
  }
  return;
}

Assistant:

void ExecutionInfoManager::ProcessBPInfoPostBreak(Js::FunctionBody* fb)
    {
        if(!fb->GetScriptContext()->ShouldPerformReplayDebuggerAction())
        {
            return;
        }

        if(this->m_activeTTDBP.HasValue())
        {
            this->ClearActiveBPInfo(fb->GetScriptContext()->GetThreadContext()->TTDContext);
        }

        if(this->m_pendingTTDBP.HasValue())
        {
            //Reset any step controller logic
            fb->GetScriptContext()->GetThreadContext()->GetDebugManager()->stepController.Deactivate();

            throw TTD::TTDebuggerAbortException::CreateTopLevelAbortRequest(this->m_pendingTTDBP.GetRootEventTime(), this->m_pendingTTDMoveMode, _u("Reverse operation requested."));
        }
    }